

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::AlgebraicConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter> *this)

{
  int index;
  int num_terms;
  AlgebraicConHandler lh;
  
  lh.
  super_ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ItemType)2>
  .reader_ = (ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ItemType)2>
              )(ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ItemType)2>
                )this;
  index = NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,
                     *(uint *)(*(long *)(this + 8) + 4));
  num_terms = NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ReadUInt
                        ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,1,
                         **(int **)(this + 8) + 1);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::AlgebraicConHandler::
  OnLinearExpr(&lh,index,num_terms);
  NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::
  ReadLinearExpr<SparsityPrinter::LinearObjHandler>
            ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,num_terms);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}